

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_ilvev_b_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  wr_t *pwt;
  wr_t *pws;
  wr_t *pwd;
  uint32_t wt_local;
  uint32_t ws_local;
  uint32_t wd_local;
  CPUMIPSState_conflict10 *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar2 = (env->active_fpu).fpr + ws;
  pfVar3 = (env->active_fpu).fpr + wt;
  *(undefined1 *)((long)pfVar1 + 0xf) = *(undefined1 *)((long)pfVar2 + 0xe);
  *(undefined1 *)((long)pfVar1 + 0xe) = *(undefined1 *)((long)pfVar3 + 0xe);
  *(undefined1 *)((long)pfVar1 + 0xd) = *(undefined1 *)((long)pfVar2 + 0xc);
  *(undefined1 *)((long)pfVar1 + 0xc) = *(undefined1 *)((long)pfVar3 + 0xc);
  *(undefined1 *)((long)pfVar1 + 0xb) = *(undefined1 *)((long)pfVar2 + 10);
  *(undefined1 *)((long)pfVar1 + 10) = *(undefined1 *)((long)pfVar3 + 10);
  *(undefined1 *)((long)pfVar1 + 9) = *(undefined1 *)((long)pfVar2 + 8);
  *(undefined1 *)((long)pfVar1 + 8) = *(undefined1 *)((long)pfVar3 + 8);
  *(undefined1 *)((long)pfVar1 + 7) = *(undefined1 *)((long)pfVar2 + 6);
  *(undefined1 *)((long)pfVar1 + 6) = *(undefined1 *)((long)pfVar3 + 6);
  *(undefined1 *)((long)pfVar1 + 5) = *(undefined1 *)((long)pfVar2 + 4);
  *(undefined1 *)((long)pfVar1 + 4) = *(undefined1 *)((long)pfVar3 + 4);
  *(undefined1 *)((long)pfVar1 + 3) = *(undefined1 *)((long)pfVar2 + 2);
  *(undefined1 *)((long)pfVar1 + 2) = *(undefined1 *)((long)pfVar3 + 2);
  *(undefined1 *)((long)pfVar1 + 1) = *(undefined1 *)pfVar2;
  *(undefined1 *)pfVar1 = *(undefined1 *)pfVar3;
  return;
}

Assistant:

void helper_msa_ilvev_b(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

#if defined(HOST_WORDS_BIGENDIAN)
    pwd->b[8]  = pws->b[9];
    pwd->b[9]  = pwt->b[9];
    pwd->b[10] = pws->b[11];
    pwd->b[11] = pwt->b[11];
    pwd->b[12] = pws->b[13];
    pwd->b[13] = pwt->b[13];
    pwd->b[14] = pws->b[15];
    pwd->b[15] = pwt->b[15];
    pwd->b[0]  = pws->b[1];
    pwd->b[1]  = pwt->b[1];
    pwd->b[2]  = pws->b[3];
    pwd->b[3]  = pwt->b[3];
    pwd->b[4]  = pws->b[5];
    pwd->b[5]  = pwt->b[5];
    pwd->b[6]  = pws->b[7];
    pwd->b[7]  = pwt->b[7];
#else
    pwd->b[15] = pws->b[14];
    pwd->b[14] = pwt->b[14];
    pwd->b[13] = pws->b[12];
    pwd->b[12] = pwt->b[12];
    pwd->b[11] = pws->b[10];
    pwd->b[10] = pwt->b[10];
    pwd->b[9]  = pws->b[8];
    pwd->b[8]  = pwt->b[8];
    pwd->b[7]  = pws->b[6];
    pwd->b[6]  = pwt->b[6];
    pwd->b[5]  = pws->b[4];
    pwd->b[4]  = pwt->b[4];
    pwd->b[3]  = pws->b[2];
    pwd->b[2]  = pwt->b[2];
    pwd->b[1]  = pws->b[0];
    pwd->b[0]  = pwt->b[0];
#endif
}